

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

nullres nullcRunFunction(char *funcName,...)

{
  char in_AL;
  nullres nVar1;
  uint functionID;
  char *argBuf;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_e8;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
LAB_0021b7e7:
    nVar1 = '\0';
  }
  else {
    local_c0 = in_RSI;
    local_b8 = in_RDX;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    if (funcName == (char *)0x0) {
      functionID = 0xffffffff;
      argBuf = (char *)0x0;
    }
    else {
      functionID = nullcFindFunctionIndex(funcName);
      if (functionID == 0xffffffff) goto LAB_0021b7e7;
      local_e8.reg_save_area = local_c8;
      local_e8.overflow_arg_area = &args[0].overflow_arg_area;
      local_e8.gp_offset = 8;
      local_e8.fp_offset = 0x30;
      argBuf = nullcGetArgumentVector(functionID,0,&local_e8);
      if (argBuf == (char *)0x0) {
        return '\0';
      }
    }
    nVar1 = nullcRunFunctionInternal(functionID,argBuf);
  }
  return nVar1;
}

Assistant:

nullres	nullcRunFunction(const char* funcName, ...)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	unsigned functionID = ~0u;

#ifndef NULLC_NO_EXECUTOR
	const char* argBuf = NULL;

	// If function is called, find it's index
	if(funcName)
	{
		functionID = nullcFindFunctionIndex(funcName);
		if(functionID == ~0u)
			return false;

		// Copy arguments in argument buffer
		va_list args;

		va_start(args, funcName);
		argBuf = nullcGetArgumentVector(functionID, 0, args);
		va_end(args);

		if(!argBuf)
			return false;
	}
#else
	(void)funcName;
#endif

	return nullcRunFunctionInternal(functionID, argBuf);
}